

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O2

void __thiscall xercesc_4_0::BMPattern::initialize(BMPattern *this)

{
  bool bVar1;
  XMLSize_t *pXVar2;
  XMLCh *pXVar3;
  ulong uVar4;
  int iVar5;
  XMLSize_t XVar6;
  undefined4 extraout_var;
  XMLCh *pXVar7;
  ulong uVar8;
  uint i;
  ulong uVar9;
  XMLCh *pXVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ArrayJanitor<char16_t> janLowercase;
  
  XVar6 = XMLString::stringLen(this->fPattern);
  iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(ulong)this->fShiftTableLen << 3);
  this->fShiftTable = (XMLSize_t *)CONCAT44(extraout_var,iVar5);
  if (this->fIgnoreCase == true) {
    pXVar7 = XMLString::replicate(this->fPattern,this->fMemoryManager);
    this->fUppercasePattern = pXVar7;
    pXVar7 = XMLString::replicate(this->fPattern,this->fMemoryManager);
    XMLString::upperCase(this->fUppercasePattern);
    XMLString::lowerCase(pXVar7);
  }
  else {
    pXVar7 = (char16_t *)0x0;
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&janLowercase,pXVar7,this->fMemoryManager);
  uVar8 = (ulong)this->fShiftTableLen;
  pXVar2 = this->fShiftTable;
  for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pXVar2[uVar9] = XVar6;
  }
  pXVar3 = this->fPattern;
  pXVar2 = this->fShiftTable;
  bVar1 = this->fIgnoreCase;
  for (uVar12 = 0; uVar9 = (ulong)uVar12, uVar9 < XVar6; uVar12 = uVar12 + 1) {
    uVar13 = ~uVar9 + XVar6;
    uVar4 = (ulong)(ushort)pXVar3[uVar9] % uVar8;
    if (uVar13 < pXVar2[uVar4]) {
      pXVar2[uVar4] = uVar13;
    }
    if ((bVar1 & 1U) != 0) {
      iVar5 = 2;
      while( true ) {
        iVar11 = iVar5 + -1;
        if (iVar5 == 0) break;
        pXVar10 = pXVar7;
        if (iVar5 == 2) {
          pXVar10 = this->fUppercasePattern;
        }
        iVar5 = iVar11;
        if (uVar13 < pXVar2[(ulong)(ushort)pXVar10[uVar9] % uVar8]) {
          pXVar2[(ulong)(ushort)pXVar10[uVar9] % uVar8] = uVar13;
        }
      }
    }
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&janLowercase);
  return;
}

Assistant:

void BMPattern::initialize() {

    const XMLSize_t patternLen = XMLString::stringLen(fPattern);
    XMLCh* lowercasePattern = 0;

    fShiftTable = (XMLSize_t*) fMemoryManager->allocate(fShiftTableLen*sizeof(XMLSize_t)); //new XMLSize_t[fShiftTableLen];

    if (fIgnoreCase) {

        fUppercasePattern = XMLString::replicate(fPattern, fMemoryManager);
        lowercasePattern = XMLString::replicate(fPattern, fMemoryManager);
        XMLString::upperCase(fUppercasePattern);
        XMLString::lowerCase(lowercasePattern);
    }

    ArrayJanitor<XMLCh> janLowercase(lowercasePattern, fMemoryManager);

    for (unsigned int i=0; i< fShiftTableLen; i++)
        fShiftTable[i] = patternLen;

    for (unsigned int k=0; k< patternLen; k++) {

        XMLCh      ch = fPattern[k];
        XMLSize_t diff = patternLen - k - 1;
        int          index = ch % fShiftTableLen;

        if (diff < fShiftTable[index])
            fShiftTable[index] = diff;

        if (fIgnoreCase) {

            for (int j=0; j< 2; j++) {

                ch = (j == 0) ? fUppercasePattern[k] : lowercasePattern[k];
                index = ch % fShiftTableLen;

                if (diff < fShiftTable[index])
                    fShiftTable[index] = diff;
            }
        }
    }
}